

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# epoll-test.c
# Opt level: O3

int create_bound_socket(void)

{
  int __fd;
  int iVar1;
  char *pcVar2;
  undefined8 uVar3;
  int enable;
  undefined4 local_1c;
  sockaddr local_18;
  
  __fd = socket(2,0x80001,0);
  if (__fd < 0) {
    pcVar2 = "sock >= 0";
    uVar3 = 0x6a;
  }
  else {
    local_1c = 1;
    iVar1 = setsockopt(__fd,1,2,&local_1c,4);
    if (iVar1 == 0) {
      local_18.sa_data[10] = '\0';
      local_18.sa_data[0xb] = '\0';
      local_18.sa_data[0xc] = '\0';
      local_18.sa_data[0xd] = '\0';
      local_18.sa_data[2] = '\0';
      local_18.sa_data[3] = '\0';
      local_18.sa_data[4] = '\0';
      local_18.sa_data[5] = '\0';
      local_18.sa_data[6] = '\0';
      local_18.sa_data[7] = '\0';
      local_18.sa_data[8] = '\0';
      local_18.sa_data[9] = '\0';
      local_18.sa_family = 2;
      local_18.sa_data[0] = '\x05';
      local_18.sa_data[1] = '9';
      iVar1 = inet_pton(2,"127.0.0.1",local_18.sa_data + 2);
      if (iVar1 == 1) {
        iVar1 = bind(__fd,&local_18,0x10);
        if (iVar1 == 0) {
          return __fd;
        }
        pcVar2 = "bind(sock, (struct sockaddr const *)&addr, sizeof(addr)) == 0";
        uVar3 = 0x76;
      }
      else {
        pcVar2 = "inet_pton(AF_INET, \"127.0.0.1\", &addr.sin_addr) == 1";
        uVar3 = 0x73;
      }
    }
    else {
      pcVar2 = "setsockopt(sock, SOL_SOCKET, SO_REUSEADDR, &enable, sizeof(int)) == 0";
      uVar3 = 0x6e;
    }
  }
  microatf_fail_require
            ("%s:%d: %s not met",
             "/workspace/llm4binary/github/license_c_cmakelists/jiixyj[P]epoll-shim/test/epoll-test.c"
             ,uVar3,pcVar2);
}

Assistant:

static int
create_bound_socket()
{
	int sock = socket(PF_INET, SOCK_STREAM | SOCK_CLOEXEC, 0);
	ATF_REQUIRE(sock >= 0);

	int enable = 1;
	ATF_REQUIRE(setsockopt(sock, SOL_SOCKET, SO_REUSEADDR, /**/
			&enable, sizeof(int)) == 0);

	struct sockaddr_in addr = { 0 };
	addr.sin_family = AF_INET;
	addr.sin_port = htons(1337);
	ATF_REQUIRE(inet_pton(AF_INET, "127.0.0.1", &addr.sin_addr) == 1);

	ATF_REQUIRE(bind(sock, /**/
			(struct sockaddr const *)&addr, sizeof(addr)) == 0);

	return sock;
}